

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int fits_parser_allocateCol(ParseData *lParse,int nCol,int *status)

{
  iteratorCol *piVar1;
  DataInfo *pDVar2;
  size_t old_num;
  
  old_num = (size_t)nCol;
  if (nCol % 0x19 == 0) {
    piVar1 = (iteratorCol *)fits_recalloc(lParse->colData,old_num,(long)(nCol + 0x19),0x110);
    lParse->colData = piVar1;
    pDVar2 = (DataInfo *)fits_recalloc(lParse->varData,old_num,(long)(nCol + 0x19),0xa0);
    lParse->varData = pDVar2;
    memset(lParse->colData + old_num,0,0x1a90);
    memset(lParse->varData + old_num,0,4000);
    if ((lParse->colData == (iteratorCol *)0x0) ||
       (pDVar2 = lParse->varData, pDVar2 == (DataInfo *)0x0)) {
      free(lParse->colData);
      free(lParse->varData);
      lParse->colData = (iteratorCol *)0x0;
      lParse->varData = (DataInfo *)0x0;
      *status = 0x71;
      return 0x71;
    }
  }
  else {
    pDVar2 = lParse->varData;
  }
  pDVar2[old_num].undef = (char *)0x0;
  (&pDVar2[old_num].undef)[1] = (char *)0x0;
  return 0;
}

Assistant:

int fits_parser_allocateCol( ParseData *lParse, int nCol, int *status )
{
   if( (nCol%25)==0 ) {
     lParse->colData = (iteratorCol*) fits_recalloc( lParse->colData,
						     nCol, nCol+25,
						     sizeof(iteratorCol) );
     lParse->varData = (DataInfo   *) fits_recalloc( lParse->varData,
						     nCol, nCol+25,
						     sizeof(DataInfo) );

     memset( (lParse->colData + nCol), 0x00, sizeof(iteratorCol)*25 );
     memset( (lParse->varData + nCol), 0x00, sizeof(DataInfo)*25    );

     if(    lParse->colData  == NULL
	    || lParse->varData  == NULL    ) {
         if( lParse->colData  ) free(lParse->colData);
         if( lParse->varData  ) free(lParse->varData);
         lParse->colData = NULL;
         lParse->varData = NULL;
         return( *status = MEMORY_ALLOCATION );
     }
   }
   lParse->varData[nCol].data  = NULL;
   lParse->varData[nCol].undef = NULL;
   return 0;
}